

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
at<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *this_00;
  Type *pTVar1;
  int in_ESI;
  long in_RDI;
  LogMessage *in_stack_ffffffffffffff38;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff50;
  LogMessage local_98;
  byte local_49;
  undefined1 local_48 [60];
  int local_c;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_49 = 0;
  local_c = in_ESI;
  if (in_ESI < 0) {
    level = (LogLevel_conflict)((ulong)local_48 >> 0x20);
    LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_49 = 1;
    in_stack_ffffffffffffff50 =
         LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x3faa5f);
  }
  if (*(int *)(in_RDI + 8) <= local_c) {
    other = &local_98;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)other >> 0x20));
    this_00 = LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)other);
    LogFinisher::operator=((LogFinisher *)this_00,other);
    LogMessage::~LogMessage((LogMessage *)0x3faada);
  }
  pTVar1 = cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)local_c * 8));
  return pTVar1;
}

Assistant:

inline typename TypeHandler::Type& RepeatedPtrFieldBase::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}